

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_GetPrototypePrimitive(JSContext *ctx,JSValue val)

{
  JSValue JVar1;
  uint uStack_3c;
  JSContext *ctx_local;
  JSValue val_local;
  
  val_local.tag._0_4_ = (undefined4)val.tag;
  switch((undefined4)val_local.tag) {
  case 0:
  case 7:
    val_local.u = ctx->class_proto[4].u;
    val_local.tag = ctx->class_proto[4].tag;
    break;
  case 1:
    val_local.u = ctx->class_proto[6].u;
    val_local.tag = ctx->class_proto[6].tag;
    break;
  case 0xfffffff8:
    val_local.u = ctx->class_proto[7].u;
    val_local.tag = ctx->class_proto[7].tag;
    break;
  case 0xfffffff9:
    val_local.u = ctx->class_proto[5].u;
    val_local.tag = ctx->class_proto[5].tag;
    break;
  case 0xffffffff:
  case 2:
  case 3:
  default:
    val_local.u.ptr = (void *)((ulong)uStack_3c << 0x20);
    val_local.tag = 2;
  }
  JVar1.tag = val_local.tag;
  JVar1.u.float64 = val_local.u.float64;
  return JVar1;
}

Assistant:

static JSValueConst JS_GetPrototypePrimitive(JSContext *ctx, JSValueConst val)
{
    switch(JS_VALUE_GET_NORM_TAG(val)) {
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        val = ctx->class_proto[JS_CLASS_BIG_INT];
        break;
    case JS_TAG_BIG_FLOAT:
        val = ctx->class_proto[JS_CLASS_BIG_FLOAT];
        break;
    case JS_TAG_BIG_DECIMAL:
        val = ctx->class_proto[JS_CLASS_BIG_DECIMAL];
        break;
#endif
    case JS_TAG_INT:
    case JS_TAG_FLOAT64:
        val = ctx->class_proto[JS_CLASS_NUMBER];
        break;
    case JS_TAG_BOOL:
        val = ctx->class_proto[JS_CLASS_BOOLEAN];
        break;
    case JS_TAG_STRING:
        val = ctx->class_proto[JS_CLASS_STRING];
        break;
    case JS_TAG_SYMBOL:
        val = ctx->class_proto[JS_CLASS_SYMBOL];
        break;
    case JS_TAG_OBJECT:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
    default:
        val = JS_NULL;
        break;
    }
    return val;
}